

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O1

void __thiscall ImplicitDepLoader::CreatePhonyInEdge(ImplicitDepLoader *this,Node *node)

{
  pointer *pppNVar1;
  iterator __position;
  Edge *pEVar2;
  Node *local_10;
  
  if (node->in_edge_ == (Edge *)0x0) {
    local_10 = node;
    pEVar2 = State::AddEdge(this->state_,&State::kPhonyRule);
    pEVar2->generated_by_dep_loader_ = true;
    local_10->in_edge_ = pEVar2;
    __position._M_current =
         (pEVar2->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pEVar2->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                ((vector<Node*,std::allocator<Node*>> *)&pEVar2->outputs_,__position,&local_10);
    }
    else {
      *__position._M_current = local_10;
      pppNVar1 = &(pEVar2->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppNVar1 = *pppNVar1 + 1;
    }
    pEVar2->outputs_ready_ = true;
  }
  return;
}

Assistant:

void ImplicitDepLoader::CreatePhonyInEdge(Node* node) {
  if (node->in_edge())
    return;

  Edge* phony_edge = state_->AddEdge(&State::kPhonyRule);
  phony_edge->generated_by_dep_loader_ = true;
  node->set_in_edge(phony_edge);
  phony_edge->outputs_.push_back(node);

  // RecomputeDirty might not be called for phony_edge if a previous call
  // to RecomputeDirty had caused the file to be stat'ed.  Because previous
  // invocations of RecomputeDirty would have seen this node without an
  // input edge (and therefore ready), we have to set outputs_ready_ to true
  // to avoid a potential stuck build.  If we do call RecomputeDirty for
  // this node, it will simply set outputs_ready_ to the correct value.
  phony_edge->outputs_ready_ = true;
}